

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardgestures.cpp
# Opt level: O0

void __thiscall QPinchGestureRecognizer::reset(QPinchGestureRecognizer *this,QGesture *state)

{
  qreal qVar1;
  QPinchGesturePrivate *gesture;
  QGestureRecognizer *in_RSI;
  long in_FS_OFFSET;
  QPinchGesturePrivate *d;
  QPinchGesture *pinch;
  QPointF local_30;
  QPointF local_20;
  Int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  gesture = QPinchGesture::d_func((QPinchGesture *)0x354edd);
  local_c = 0;
  QFlags<QPinchGesture::ChangeFlag>::QFlags((QFlags<QPinchGesture::ChangeFlag> *)0x354ef4);
  (gesture->changeFlags).super_QFlagsStorageHelper<QPinchGesture::ChangeFlag,_4>.
  super_QFlagsStorage<QPinchGesture::ChangeFlag>.i = local_c;
  *(Int *)&(gesture->super_QGesturePrivate).field_0xa4 =
       (gesture->changeFlags).super_QFlagsStorageHelper<QPinchGesture::ChangeFlag,_4>.
       super_QFlagsStorage<QPinchGesture::ChangeFlag>.i;
  QPointF::QPointF(&local_20);
  (gesture->centerPoint).xp = local_20.xp;
  (gesture->centerPoint).yp = local_20.yp;
  qVar1 = (gesture->centerPoint).yp;
  (gesture->lastCenterPoint).xp = (gesture->centerPoint).xp;
  (gesture->lastCenterPoint).yp = qVar1;
  qVar1 = (gesture->lastCenterPoint).yp;
  (gesture->startCenterPoint).xp = (gesture->lastCenterPoint).xp;
  (gesture->startCenterPoint).yp = qVar1;
  gesture->scaleFactor = 1.0;
  gesture->lastScaleFactor = 1.0;
  gesture->totalScaleFactor = 1.0;
  gesture->rotationAngle = 0.0;
  gesture->lastRotationAngle = 0.0;
  gesture->totalRotationAngle = 0.0;
  gesture->isNewSequence = true;
  QPointF::QPointF(&local_30);
  gesture->startPosition[1].xp = local_30.xp;
  gesture->startPosition[1].yp = local_30.yp;
  qVar1 = gesture->startPosition[1].yp;
  gesture->startPosition[0].xp = gesture->startPosition[1].xp;
  gesture->startPosition[0].yp = qVar1;
  QGestureRecognizer::reset(in_RSI,(QGesture *)gesture);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPinchGestureRecognizer::reset(QGesture *state)
{
    QPinchGesture *pinch = static_cast<QPinchGesture *>(state);
    QPinchGesturePrivate *d = pinch->d_func();

    d->totalChangeFlags = d->changeFlags = { };

    d->startCenterPoint = d->lastCenterPoint = d->centerPoint = QPointF();
    d->totalScaleFactor = d->lastScaleFactor = d->scaleFactor = 1;
    d->totalRotationAngle = d->lastRotationAngle = d->rotationAngle = 0;

    d->isNewSequence = true;
    d->startPosition[0] = d->startPosition[1] = QPointF();

    QGestureRecognizer::reset(state);
}